

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 108_sortedArrayToBinarySearchTree.cpp
# Opt level: O3

TreeNode * sortedAtoBST(vector<int,_std::allocator<int>_> *nums,int start,int end)

{
  TreeNode *pTVar1;
  TreeNode *pTVar2;
  int end_00;
  
  if (start < end) {
    end_00 = (end + start) / 2;
    pTVar1 = (TreeNode *)operator_new(0x18);
    pTVar1->val = (nums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[end_00];
    pTVar2 = sortedAtoBST(nums,start,end_00);
    pTVar1->left = pTVar2;
    pTVar2 = sortedAtoBST(nums,end_00 + 1,end);
    pTVar1->right = pTVar2;
  }
  else {
    pTVar1 = (TreeNode *)0x0;
  }
  return pTVar1;
}

Assistant:

TreeNode* sortedAtoBST(vector<int>& nums,int start,int end)
{
    if (end<=start)
        return NULL;
    int middle = (start+end)/2;
    TreeNode* root = new TreeNode(nums[middle]);
    root->left = sortedAtoBST(nums,start,middle);
    root->right = sortedAtoBST(nums,middle+1,end);
    return root;
}